

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ReduceRightObjectHelper<unsigned_long>
              (RecyclableObject *obj,unsigned_long length,unsigned_long start,
              RecyclableObject *callBackFn,Var accumulator,ScriptContext *scriptContext)

{
  ThreadContext *pTVar1;
  uint64 index_00;
  Var pvVar2;
  JavascriptMethod p_Var3;
  JavascriptLibrary *this;
  RecyclableObject *pRVar4;
  Var pvVar5;
  CallInfo local_b8;
  CallInfo local_b0;
  undefined1 local_a8 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  unsigned_long uStack_90;
  BOOL hasItem;
  unsigned_long k;
  unsigned_long index;
  Var element;
  undefined1 local_68 [8];
  JsReentLock jsReentLock;
  ScriptContext *scriptContext_local;
  Var accumulator_local;
  RecyclableObject *callBackFn_local;
  unsigned_long start_local;
  unsigned_long length_local;
  RecyclableObject *obj_local;
  
  jsReentLock._24_8_ = scriptContext;
  pTVar1 = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_68,pTVar1);
  JsReentLock::setObjectForMutation((JsReentLock *)local_68,obj);
  scriptContext_local = (ScriptContext *)accumulator;
  for (uStack_90 = start; uStack_90 < length; uStack_90 = uStack_90 + 1) {
    index_00 = ~uStack_90 + length;
    JsReentLock::unlock((JsReentLock *)local_68);
    autoReentrancyHandler._12_4_ = Js::JavascriptOperators::HasItem(obj,index_00);
    JsReentLock::MutateArrayObject((JsReentLock *)local_68);
    JsReentLock::relock((JsReentLock *)local_68);
    if (autoReentrancyHandler._12_4_ != 0) {
      JsReentLock::unlock((JsReentLock *)local_68);
      pvVar2 = Js::JavascriptOperators::GetItem(obj,index_00,(ScriptContext *)jsReentLock._24_8_);
      pTVar1 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_a8,pTVar1);
      pTVar1 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar1);
      pTVar1 = ScriptContext::GetThreadContext((ScriptContext *)jsReentLock._24_8_);
      ThreadContext::AssertJsReentrancy(pTVar1);
      p_Var3 = RecyclableObject::GetEntryPoint(callBackFn);
      CheckIsExecutable(callBackFn,p_Var3);
      p_Var3 = RecyclableObject::GetEntryPoint(callBackFn);
      CallInfo::CallInfo(&local_b0,CallFlags_Value,5);
      CallInfo::CallInfo(&local_b8,CallFlags_Value,5);
      this = ScriptContext::GetLibrary((ScriptContext *)jsReentLock._24_8_);
      pRVar4 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      pvVar5 = JavascriptNumber::ToVar(index_00,(ScriptContext *)jsReentLock._24_8_);
      scriptContext_local =
           (ScriptContext *)
           (*p_Var3)(callBackFn,(CallInfo)callBackFn,local_b0,0,0,0,0,local_b8,pRVar4,
                     scriptContext_local,pvVar2,pvVar5,obj);
      AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_a8);
      JsReentLock::MutateArrayObject((JsReentLock *)local_68);
      JsReentLock::relock((JsReentLock *)local_68);
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_68);
  return scriptContext_local;
}

Assistant:

Var JavascriptArray::ReduceRightObjectHelper(RecyclableObject* obj, T length, T start, RecyclableObject* callBackFn, Var accumulator, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, obj);

        Var element = nullptr;
        T index = 0;

        for (T k = start; k < length; k++)
        {
            index = length - k - 1;
            JS_REENTRANT(jsReentLock, BOOL hasItem = JavascriptOperators::HasItem(obj, index));
            if (hasItem)
            {
                JS_REENTRANT(jsReentLock,
                    element = JavascriptOperators::GetItem(obj, index, scriptContext);
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        accumulator = CALL_FUNCTION(scriptContext->GetThreadContext(),
                                callBackFn, CallInfo(CallFlags_Value, 5), scriptContext->GetLibrary()->GetUndefined(),
                                accumulator,
                                element,
                                JavascriptNumber::ToVar(index, scriptContext),
                                obj);
                    }
                    END_SAFE_REENTRANT_CALL
                );
            }
        }

        return accumulator;
    }